

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O1

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/error_object.cpp:131:62)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_error_object_cpp:131:62)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  bool bVar1;
  long *plVar2;
  gc_heap *local_30;
  uint32_t local_28;
  
  if (this_->type_ == object) {
    bVar1 = gc_heap_ptr_untyped::has_type<mjs::error_object>
                      ((gc_heap_ptr_untyped *)&(this_->field_1).s_);
    if (bVar1) {
      gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&(this_->field_1).s_);
      error_object::to_string((error_object *)&stack0xffffffffffffffd0);
      __return_storage_ptr__->type_ = string;
      (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.
      super_gc_heap_ptr_untyped.heap_ = local_30;
      *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_28;
      if (local_30 != (gc_heap *)0x0) {
        gc_heap::attach(local_30,(gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
      }
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffd0);
      if (bVar1) {
        return __return_storage_ptr__;
      }
    }
  }
  plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
  (**(code **)(*plVar2 + 0x98))(&stack0xffffffffffffffd0,plVar2,"Error");
  __return_storage_ptr__->type_ = string;
  (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
  heap_ = local_30;
  *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_28;
  if (local_30 != (gc_heap *)0x0) {
    gc_heap::attach(local_30,(gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffd0);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }